

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

ON_wString * __thiscall ON_wString::Set(ON_wString *this,wchar_t *wsz,int numChars)

{
  wchar_t *pwVar1;
  ON_Internal_Empty_wString *pOVar2;
  size_t array_capacity;
  
  CopyArray(this);
  array_capacity = (size_t)numChars;
  pwVar1 = ReserveArray(this,array_capacity);
  if (pwVar1 != (wchar_t *)0x0) {
    memmove(pwVar1,wsz,array_capacity * 4);
    pwVar1 = this->m_s;
    pwVar1[array_capacity] = L'\0';
    pOVar2 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar2 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    (pOVar2->header).string_length = numChars;
  }
  return this;
}

Assistant:

const ON_wString& ON_wString::Set(const wchar_t* wsz, int numChars)
{
  CopyArray();

  auto* pBuffer = ReserveArray(numChars);
  if (nullptr != pBuffer)
  {
    memmove(pBuffer, wsz, numChars * sizeof(wchar_t));
    m_s[numChars] = 0;
    Header()->string_length = numChars;
  }

  return *this;
}